

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Backward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> *pcVar1;
  int64_t iVar2;
  long lVar3;
  complex<double> **ppcVar4;
  complex<double> *pcVar5;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  complex<double> *BPtr;
  complex<double> *end_ki;
  complex<double> *elem_ki;
  complex<double> val;
  int64_t k;
  int64_t j;
  int64_t Dimension;
  char *in_stack_00000148;
  char *in_stack_00000150;
  complex<double> *in_stack_ffffffffffffff48;
  complex<double> *in_stack_ffffffffffffff50;
  complex<double> *in_stack_ffffffffffffff58;
  TPZFMatrix<std::complex<double>_> *__z;
  complex<double> *in_stack_ffffffffffffff60;
  uint7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  bool bVar6;
  TPZFMatrix<std::complex<double>_> *this_00;
  complex<double> *local_58;
  complex<double> local_50;
  complex<double> local_40;
  long local_30;
  TPZFMatrix<std::complex<double>_> *local_28;
  long local_20;
  TPZBaseMatrix *local_18;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if ((iVar2 != lVar3) || ((char)in_RDI[3] != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000150,in_stack_00000148);
  }
  local_20 = (**(code **)(*in_RDI + 0x60))();
  if (local_20 != 0) {
    local_28 = (TPZFMatrix<std::complex<double>_> *)0x0;
    while (this_00 = local_28, iVar2 = TPZBaseMatrix::Cols(local_18), lVar3 = local_20,
          (long)this_00 < iVar2) {
      do {
        local_30 = lVar3 + -1;
        bVar6 = false;
        if (0 < local_30) {
          in_stack_ffffffffffffff60 =
               TPZFMatrix<std::complex<double>_>::operator()
                         (this_00,(ulong)in_stack_ffffffffffffff68,
                          (int64_t)in_stack_ffffffffffffff60);
          std::complex<double>::complex(&local_40,0.0,0.0);
          bVar6 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        lVar3 = local_30;
      } while (bVar6 != false);
      in_stack_ffffffffffffff6f = 0;
      for (; 0 < local_30; local_30 = local_30 + -1) {
        std::complex<double>::complex(&local_50,0.0,0.0);
        ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_30);
        local_58 = *ppcVar4;
        ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                            ((TPZVec<std::complex<double>_*> *)(in_RDI + 4),local_30 + 1);
        pcVar1 = *ppcVar4;
        pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                           (this_00,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                            (int64_t)in_stack_ffffffffffffff60);
        std::complex<double>::operator/=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        local_50._M_value._0_8_ = *(undefined8 *)pcVar5->_M_value;
        local_50._M_value._8_8_ = *(undefined8 *)(pcVar5->_M_value + 8);
        while (local_58 = local_58 + 1, local_58 < pcVar1) {
          std::operator*(in_stack_ffffffffffffff48,(complex<double> *)0x137e039);
          std::complex<double>::operator-=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
      }
      local_28 = (TPZFMatrix<std::complex<double>_> *)
                 ((long)&(local_28->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                         super_TPZSavable._vptr_TPZSavable + 1);
    }
    local_28 = (TPZFMatrix<std::complex<double>_> *)0x0;
    while (__z = local_28, iVar2 = TPZBaseMatrix::Cols(local_18), (long)__z < iVar2) {
      TPZVec<std::complex<double>_*>::operator[]((TPZVec<std::complex<double>_*> *)(in_RDI + 4),0);
      TPZFMatrix<std::complex<double>_>::operator()
                (this_00,CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                 (int64_t)in_stack_ffffffffffffff60);
      std::complex<double>::operator/=(in_stack_ffffffffffffff60,(complex<double> *)__z);
      local_28 = (TPZFMatrix<std::complex<double>_> *)
                 ((long)&local_28->super_TPZMatrix<std::complex<double>_> + 1);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}